

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalOperator::Copy(LogicalOperator *this,ClientContext *context)

{
  Allocator *allocator_p;
  ClientContext *in_RDX;
  SerializationOptions options;
  MemoryStream stream;
  bound_parameter_map_t parameters;
  BinarySerializer serializer;
  undefined1 *local_698;
  long local_690;
  undefined1 local_688 [16];
  size_type local_678;
  char local_670;
  MemoryStream local_668;
  undefined1 local_618 [8];
  _Alloc_hider local_610;
  char local_600 [16];
  size_type local_5f0;
  bool local_5e8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_5e0 [2];
  BinarySerializer local_560;
  
  allocator_p = Allocator::Get(in_RDX);
  MemoryStream::MemoryStream(&local_668,allocator_p,0x200);
  SerializationCompatibility::Default();
  SerializationCompatibility::Latest();
  ::std::__cxx11::string::operator=((string *)&local_698,(string *)&local_560);
  local_678 = local_560.super_Serializer.options.serialization_compatibility.duckdb_version.field_2.
              _M_allocated_capacity;
  local_670 = local_560.super_Serializer.options.serialization_compatibility.duckdb_version.field_2.
              _M_local_buf[8];
  if ((SerializationCompatibility *)local_560.super_Serializer._vptr_Serializer !=
      &local_560.super_Serializer.options.serialization_compatibility) {
    operator_delete(local_560.super_Serializer._vptr_Serializer);
  }
  local_618[0] = false;
  local_618[1] = false;
  local_610._M_p = local_600;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_610,local_698,local_698 + local_690);
  local_5e8 = (bool)local_670;
  local_5f0 = local_678;
  BinarySerializer::BinarySerializer
            (&local_560,&local_668.super_WriteStream,(SerializationOptions *)local_618);
  if (local_610._M_p != local_600) {
    operator_delete(local_610._M_p);
  }
  BinarySerializer::OnObjectBegin(&local_560);
  (**(code **)((long)&(((context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_
                        .internal.
                        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->config).home_directory + 8))(context,&local_560);
  BinarySerializer::OnObjectEnd(&local_560);
  MemoryStream::Rewind(&local_668);
  local_5e0[0]._M_buckets = &local_5e0[0]._M_single_bucket;
  local_5e0[0]._M_bucket_count = 1;
  local_5e0[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_5e0[0]._M_element_count = 0;
  local_5e0[0]._M_rehash_policy._M_max_load_factor = 1.0;
  local_5e0[0]._M_rehash_policy._M_next_resize = 0;
  local_5e0[0]._M_single_bucket = (__node_base_ptr)0x0;
  BinaryDeserializer::Deserialize<duckdb::LogicalOperator>
            ((BinaryDeserializer *)this,&local_668.super_ReadStream,in_RDX,
             (bound_parameter_map_t *)local_5e0);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_5e0);
  local_560.super_Serializer._vptr_Serializer = (_func_int **)&PTR__BinarySerializer_01997298;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_560.data.customs._M_h);
  ::std::
  _Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
                  *)&local_560.data.compression_infos);
  ::std::
  _Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
                  *)&local_560.data.types);
  ::std::
  _Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
                  *)&local_560.data.parameter_data);
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_560.data.enums);
  ::std::
  _Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
                  *)&local_560.data.catalogs);
  ::std::
  _Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
                  *)&local_560.data.databases);
  ::std::
  _Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
                  *)&local_560.data);
  ::std::
  vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  ::~vector(&local_560.debug_stack.
             super_vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
           );
  Serializer::~Serializer(&local_560.super_Serializer);
  if (local_698 != local_688) {
    operator_delete(local_698);
  }
  MemoryStream::~MemoryStream(&local_668);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalOperator::Copy(ClientContext &context) const {
	MemoryStream stream(Allocator::Get(context));
	SerializationOptions options;
	options.serialization_compatibility = SerializationCompatibility::Latest();
	BinarySerializer serializer(stream, options);
	try {
		serializer.Begin();
		this->Serialize(serializer);
		serializer.End();
	} catch (NotImplementedException &ex) {
		ErrorData error(ex);
		throw NotImplementedException("Logical Operator Copy requires the logical operator and all of its children to "
		                              "be serializable: " +
		                              error.RawMessage());
	}
	stream.Rewind();
	bound_parameter_map_t parameters;
	auto op_copy = BinaryDeserializer::Deserialize<LogicalOperator>(stream, context, parameters);
	return op_copy;
}